

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O2

bool __thiscall nite::Texture::load(Texture *this,string *path,Color *transparency)

{
  Color *pCVar1;
  uchar *puVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  __type _Var7;
  int i;
  ulong uVar8;
  uchar *img_data;
  size_t in_RCX;
  pointer ptVar9;
  bool *pbVar10;
  int number;
  long lVar11;
  pointer ptVar12;
  int iVar13;
  ulong uVar14;
  Color *tr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string local_140;
  Texture *local_120 [17];
  undefined1 local_98 [8];
  string fileHash;
  int local_3c;
  int local_38;
  int Channels;
  int Width;
  int Height;
  
  bVar6 = fileExists(path);
  if (bVar6) {
    unload(this);
    hashMemory_abi_cxx11_
              ((string *)local_98,(nite *)(path->_M_dataplus)._M_p,(char *)path->_M_string_length,
               in_RCX);
    lVar11 = 8;
    ptVar9 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
             super__Vector_impl_data._M_finish;
    ptVar12 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar14 = 0; uVar8 = ((long)ptVar9 - (long)ptVar12) / 0x88, local_120[0] = this,
        uVar14 < uVar8; uVar14 = uVar14 + 1) {
      if ((*(char *)((long)ptVar12 + lVar11 + -4) == '\0') &&
         (_Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&ptVar12->texture + lVar11),(string *)local_98),
         ptVar12 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                   super__Vector_impl_data._M_start,
         ptVar9 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                  super__Vector_impl_data._M_finish, _Var7)) {
        this->objectId = (int)uVar14;
        std::vector<nite::Texture*,std::allocator<nite::Texture*>>::emplace_back<nite::Texture*>
                  ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)
                   &ptVar12[uVar14 & 0xffffffff].owners,local_120);
        Rect::set(&this->region,0.0,0.0,
                  (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl
                         .super__Vector_impl_data._M_start[this->objectId].Width,
                  (float)textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl
                         .super__Vector_impl_data._M_start[this->objectId].Height);
        bVar6 = false;
        goto LAB_001a0cd1;
      }
      lVar11 = lVar11 + 0x88;
    }
    this->objectId = -1;
    pbVar10 = &ptVar12->empty;
    for (uVar14 = 0; uVar8 != uVar14; uVar14 = uVar14 + 1) {
      if (*pbVar10 != false) goto LAB_001a0906;
      pbVar10 = pbVar10 + 0x88;
    }
    textureT::textureT((textureT *)local_120);
    std::vector<textureT,_std::allocator<textureT>_>::emplace_back<textureT>
              (&textureList,(textureT *)local_120);
    textureT::~textureT((textureT *)local_120);
    ptVar12 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
              super__Vector_impl_data._M_start;
    uVar14 = uVar8;
LAB_001a0906:
    iVar13 = (int)uVar14;
    this->objectId = iVar13;
    ptVar12[iVar13].empty = false;
    std::vector<nite::Texture*,std::allocator<nite::Texture*>>::emplace_back<nite::Texture*>
              ((vector<nite::Texture*,std::allocator<nite::Texture*>> *)&ptVar12[iVar13].owners,
               local_120);
    std::__cxx11::string::_M_assign
              ((string *)
               &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].Hash);
    std::__cxx11::string::_M_assign
              ((string *)
               &textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                super__Vector_impl_data._M_start[this->objectId].filename);
    img_data = SOIL_load_image((path->_M_dataplus)._M_p,&local_38,&Channels,&local_3c,0);
    bVar6 = img_data != (uchar *)0x0;
    if (img_data == (uchar *)0x0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileHash.field_2 + 8),"failed to load texture \'",path);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileHash.field_2 + 8),"\': unsupported format");
      print((string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)(fileHash.field_2._M_local_buf + 8));
    }
    else {
      if ((transparency->a != -1.0) || (NAN(transparency->a))) {
        for (lVar11 = 0; lVar11 < (long)local_3c * (long)Channels * (long)local_38;
            lVar11 = lVar11 + 4) {
          fVar3 = transparency->r * 255.0;
          if ((fVar3 == (float)img_data[lVar11]) && (!NAN(fVar3) && !NAN((float)img_data[lVar11])))
          {
            fVar3 = transparency->g * 255.0;
            if ((fVar3 == (float)img_data[lVar11 + 1]) &&
               (!NAN(fVar3) && !NAN((float)img_data[lVar11 + 1]))) {
              fVar3 = transparency->b * 255.0;
              if ((fVar3 == (float)img_data[lVar11 + 2]) &&
                 (!NAN(fVar3) && !NAN((float)img_data[lVar11 + 2]))) {
                puVar2 = img_data + lVar11;
                puVar2[0] = '\0';
                puVar2[1] = '\0';
                puVar2[2] = '\0';
                puVar2[3] = '\0';
              }
            }
          }
        }
      }
      glEnable(0xde1);
      glTexParameteri(0xde1,0x2800,0x2600);
      glTexParameteri(0xde1,0x2801,0x2600);
      glTexParameterf(0x47012f00,0xde1,0x2802);
      glTexParameterf(0x47012f00,0xde1,0x2803);
      glGenTextures(1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
                      super__Vector_impl_data._M_start + this->objectId);
      glBindTexture(0xde1,textureList.super__Vector_base<textureT,_std::allocator<textureT>_>.
                          _M_impl.super__Vector_impl_data._M_start[this->objectId].texture);
      glTexImage2D(0xde1,0,0x1908,local_38,Channels,0,0x1908,0x1401,img_data);
      glBindTexture(0xde1,0);
      glDisable(0xde1);
      ptVar9 = textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar13 = this->objectId;
      textureList.super__Vector_base<textureT,_std::allocator<textureT>_>._M_impl.
      super__Vector_impl_data._M_start[iVar13].id = iVar13;
      ptVar9[iVar13].Width = local_38;
      ptVar9[iVar13].Height = Channels;
      ptVar9[iVar13].Channels = local_3c;
      fVar3 = transparency->g;
      fVar4 = transparency->b;
      fVar5 = transparency->a;
      pCVar1 = &ptVar9[iVar13].transparency;
      pCVar1->r = transparency->r;
      pCVar1->g = fVar3;
      pCVar1->b = fVar4;
      pCVar1->a = fVar5;
      std::__cxx11::string::_M_assign((string *)this);
      Rect::set(&this->region,0.0,0.0,(float)local_38,(float)Channels);
      std::operator+(&local_160,"loaded texture \'",path);
      std::operator+(&local_180,&local_160,"\'(");
      toStr_abi_cxx11_(&local_140,(nite *)(ulong)(uint)this->objectId,number);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileHash.field_2 + 8),&local_180,&local_140);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&fileHash.field_2 + 8),")");
      print((string *)local_120);
      std::__cxx11::string::~string((string *)local_120);
      std::__cxx11::string::~string((string *)(fileHash.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_140);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
      SOIL_free_image_data(img_data);
    }
LAB_001a0cd1:
    std::__cxx11::string::~string((string *)local_98);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   "fail to load texture \'",path);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                   "\': it doesn\'t exist");
    print((string *)local_120);
    std::__cxx11::string::~string((string *)local_120);
    std::__cxx11::string::~string((string *)local_98);
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool nite::Texture::load(const String &path, const nite::Color &transparency){
	if(!nite::fileExists(path)){
		nite::print("fail to load texture '"+path+"': it doesn't exist");
		return false;
	}
	unload();
	String fileHash = nite::hashMemory((char*)path.c_str(), path.length());
	objectId = getSlotByHash(fileHash);
	if (objectId <= -1){
		objectId = getEmptySlot();
		textureList[objectId].empty = 0;
		textureList[objectId].owners.push_back(this);
		textureList[objectId].Hash = fileHash;
    	textureList[objectId].filename = path;
	}else{
		textureList[objectId].owners.push_back(this);
		region.set(0, 0, textureList[objectId].Width, textureList[objectId].Height);
		return false;
	}

	int Width;
	int Height;
	int Channels;
	GLubyte *Pixels = SOIL_load_image(path.c_str(), &Width, &Height, &Channels, SOIL_LOAD_AUTO);
	if (Pixels == NULL){
		nite::print("failed to load texture '"+path+"': unsupported format");
		return false;
	}
	if(transparency.a != -1.0){
		for(int i = 0; i < Width * Height * Channels; i += 4){
			const nite::Color &tr = transparency;
			#define uchar unsigned char
			uchar &r = Pixels[i];
			uchar &g = Pixels[i + 1];
			uchar &b = Pixels[i + 2];
			uchar &a = Pixels[i + 3];
			if(r == (tr.r * 255.0) && g == (tr.g * 255.0) && b == (tr.b * 255.0)){
				r = 0; g = 0;	b = 0; a = 0;
			}
		}
	}
	glEnable(GL_TEXTURE_2D);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
	glTexParameterf(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
	glGenTextures(1, &textureList[objectId].texture);
	glBindTexture(GL_TEXTURE_2D, textureList[objectId].texture);
	glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, Width, Height, 0, GL_RGBA, GL_UNSIGNED_BYTE, Pixels);
	glBindTexture(GL_TEXTURE_2D, 0);
	glDisable(GL_TEXTURE_2D);
	textureList[objectId].id = objectId;
	textureList[objectId].Width	= Width;
	textureList[objectId].Height = Height;
	textureList[objectId].Channels = Channels;
	textureList[objectId].transparency = transparency;
	this->filename = path;
	region.set(0, 0, Width, Height);
	nite::print("loaded texture '"+path+"'("+nite::toStr(objectId)+")");
	SOIL_free_image_data(Pixels);
	return true;
}